

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void check_small_alloc_info(small_alloc *alloc,size_t size,_Bool is_large,size_t real_size)

{
  undefined1 local_38 [8];
  small_alloc_info info;
  size_t real_size_local;
  _Bool is_large_local;
  size_t size_local;
  small_alloc *alloc_local;
  
  info.real_size = real_size;
  small_alloc_info(alloc,(void *)0x0,size,(small_alloc_info *)local_38);
  if ((_Bool)(local_38[0] & 1U) != is_large) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "info.is_large == is_large","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
            ,0x92,"check_small_alloc_info");
    exit(-1);
  }
  if (info._0_8_ != info.real_size) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "info.real_size == real_size","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
            ,0x93,"check_small_alloc_info");
    exit(-1);
  }
  return;
}

Assistant:

static inline void
check_small_alloc_info(struct small_alloc *alloc, size_t size, bool is_large,
		       size_t real_size)
{
	struct small_alloc_info info;
	small_alloc_info(alloc, NULL, size, &info);
	fail_unless(info.is_large == is_large);
	fail_unless(info.real_size == real_size);
}